

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseIntegerWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int32_t iVar1;
  char16_t cVar2;
  int32_t iVar3;
  IntegerWidth IVar4;
  anon_union_8_2_136a0349_for_fUnion local_60;
  undefined1 local_58;
  int local_2c;
  int local_28;
  int32_t maxInt;
  int32_t minInt;
  int32_t offset;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  maxInt = 0;
  local_28 = 0;
  _minInt = status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)segment;
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar2 == L'+') {
    local_2c = -1;
    maxInt = maxInt + 1;
  }
  else {
    local_2c = 0;
  }
  while ((iVar1 = maxInt,
         iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local), iVar1 < iVar3
         && (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxInt),
            cVar2 == L'#'))) {
    local_2c = local_2c + 1;
    maxInt = maxInt + 1;
  }
  iVar1 = maxInt;
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    while ((iVar1 = maxInt,
           iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local),
           iVar1 < iVar3 &&
           (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxInt),
           cVar2 == L'0'))) {
      local_28 = local_28 + 1;
      maxInt = maxInt + 1;
    }
  }
  iVar1 = maxInt;
  if (local_2c != -1) {
    local_2c = local_28 + local_2c;
  }
  iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
  if (iVar1 < iVar3) {
    *_minInt = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else if (local_2c == -1) {
    IVar4 = IntegerWidth::zeroFillTo(local_28);
    *(anon_union_8_2_136a0349_for_fUnion *)(status_local + 0x1f) = IVar4.fUnion;
    *(bool *)(status_local + 0x21) = IVar4.fHasError;
  }
  else {
    IVar4 = IntegerWidth::zeroFillTo(local_28);
    local_60 = IVar4.fUnion;
    local_58 = IVar4.fHasError;
    IVar4 = IntegerWidth::truncateAt((IntegerWidth *)&local_60.minMaxInt,local_2c);
    *(anon_union_8_2_136a0349_for_fUnion *)(status_local + 0x1f) = IVar4.fUnion;
    *(bool *)(status_local + 0x21) = IVar4.fHasError;
  }
  return;
}

Assistant:

void blueprint_helpers::parseIntegerWidthOption(const StringSegment& segment, MacroProps& macros,
                                                UErrorCode& status) {
    int32_t offset = 0;
    int32_t minInt = 0;
    int32_t maxInt;
    if (segment.charAt(0) == u'+') {
        maxInt = -1;
        offset++;
    } else {
        maxInt = 0;
    }
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'#') {
            maxInt++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        for (; offset < segment.length(); offset++) {
            if (segment.charAt(offset) == u'0') {
                minInt++;
            } else {
                break;
            }
        }
    }
    if (maxInt != -1) {
        maxInt += minInt;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid integer width stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxInt == -1) {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt);
    } else {
        macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
    }
}